

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O0

void __thiscall Chromosome::Chromosome(Chromosome *this,size_t g,size_t as)

{
  value_type local_30;
  ulong local_28;
  size_t i;
  size_t as_local;
  size_t g_local;
  Chromosome *this_local;
  
  this->_vptr_Chromosome = (_func_int **)&PTR__Chromosome_00147800;
  this->CHROMOSOME_SIZE = 0x32;
  this->ALLELE_SIZE = as;
  i = as;
  as_local = g;
  g_local = (size_t)this;
  std::vector<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>::vector(&this->genes);
  for (local_28 = 0; local_28 < as_local; local_28 = local_28 + 1) {
    std::bitset<50UL>::bitset(&local_30,0);
    add_gene(this,local_30);
  }
  Randomize_genes(this);
  return;
}

Assistant:

Chromosome::Chromosome( size_t g, size_t as ) :
	CHROMOSOME_SIZE(CHROMSIZE), ALLELE_SIZE(as)
{
	for(size_t i = 0; i < g; ++i)
	{
		add_gene();
	}

	Randomize_genes();

}